

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_barcode<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,true>>>
               (void)

{
  _List_node_base *__args;
  uint *__args_1;
  _Hash_node_base *p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  _Base_ptr p_Var4;
  Column_settings *pCVar5;
  Column_settings *pCVar6;
  uint uVar7;
  bool bVar8;
  _Rb_tree_node_base *p_Var9;
  undefined1 *puVar10;
  uint rowIndex;
  _List_node_base *p_Var11;
  witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_true>_>_>_>
  *witness;
  undefined4 local_524;
  undefined4 *local_520;
  _Base_ptr local_518;
  undefined **local_510;
  ulong local_508;
  shared_count sStack_500;
  undefined4 **local_4f8;
  undefined8 local_4f0;
  uint local_4e8 [2];
  undefined8 *local_4e0;
  _Base_ptr *local_4d8;
  undefined1 local_4d0 [8];
  undefined8 local_4c8;
  shared_count sStack_4c0;
  char *local_4b8;
  char *local_4b0;
  undefined **local_4a8;
  char *local_4a0;
  undefined8 *local_498;
  char *local_490;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars2;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_428;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars3;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_true>_>
  m;
  
  build_longer_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,true>>>>
            ();
  m.colSettings_ = (Column_settings *)operator_new(0x38);
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,true>>>
  ::Chain_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,true>>>
              *)&m.matrix_,&local_428,m.colSettings_);
  build_longer_chain_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,true>>>>
            ();
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       local_428.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_428.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  bars1._M_t._M_impl._0_8_ =
       local_428.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_428.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_428.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)bars2._M_t._M_impl._0_8_;
  local_428.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  bars2._M_t._M_impl._0_8_ = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&bars1);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&bars2);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,true>>>
            (&local_428,&m);
  bars2._M_t._M_impl._0_8_ = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  build_longer_chain_row_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,true>>>>
            ();
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  uVar2 = bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  bars1._M_t._M_impl._0_8_ = bars2._M_t._M_impl._0_8_;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  bars2._M_t._M_impl._0_8_ = bars3._M_t._M_impl._0_8_;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
  uVar3 = bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = (_Rb_tree_color)uVar2;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = SUB84(uVar2,4);
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
  bars3._M_t._M_impl._0_8_ = 0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = uVar3;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&bars1);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&bars3);
  uVar2 = bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  if (bars2._M_t._M_impl._0_8_ != bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_) {
    rowIndex = 0;
    witness = (witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_true>_>_>_>
               *)bars2._M_t._M_impl._0_8_;
    do {
      uVar7 = 6;
      if (rowIndex != 6) {
        get_ordered_row<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,true>>>
                  ((column_content<typename_Matrix<Chain_rep_options_with_row_access<true,_(Column_types)7,_true,_true,_false,_true,_false,_true>_>::Column>
                    *)&bars1,&m,rowIndex);
        test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,true>>>>
                  (witness,(column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_true>_>_>_>
                            *)&bars1);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&bars1);
        uVar7 = rowIndex + 1;
      }
      rowIndex = uVar7;
      witness = witness + 1;
    } while (witness !=
             (witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_true>_>_>_>
              *)uVar2);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&bars2);
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars1._M_t._M_impl.super__Rb_tree_header._M_header;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       bars1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars2._M_t._M_impl.super__Rb_tree_header._M_header;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars3._M_t._M_impl.super__Rb_tree_header._M_header;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((Chain_pairing_option *)
      m.matrix_.super_Chain_pairing_option.barcode_.
      super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
      ._M_impl._M_node.super__List_node_base._M_next != &m.matrix_.super_Chain_pairing_option) {
    p_Var11 = m.matrix_.super_Chain_pairing_option.barcode_.
              super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    do {
      __args = p_Var11 + 1;
      __args_1 = (uint *)((long)&p_Var11[1]._M_next + 4);
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars1,(int *)__args,__args_1,(uint *)&p_Var11[1]._M_prev);
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars2,(int *)__args,__args_1,(uint *)&p_Var11[1]._M_prev);
      local_4e8[0] = *(uint *)&p_Var11[1]._M_prev;
      local_4f0 = (undefined **)__args->_M_next;
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int&,unsigned_int&,unsigned_int&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars3,(int *)&local_4f0,(uint *)((long)&local_4f0 + 4),local_4e8);
      p_Var11 = p_Var11->_M_next;
    } while ((Chain_pairing_option *)p_Var11 != &m.matrix_.super_Chain_pairing_option);
  }
  p_Var4 = bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_178,0x574);
  local_4a0 = (char *)((ulong)local_4a0 & 0xffffffffffffff00);
  local_4a8 = &PTR__lazy_ostream_00230130;
  local_498 = &boost::unit_test::lazy_ostream::inst;
  local_490 = "";
  local_518 = (_Base_ptr)&p_Var4[1]._M_parent;
  local_520 = &local_524;
  local_524 = 0;
  local_4d0[0] = *(int *)&p_Var4[1]._M_parent == 0;
  local_4c8 = 0;
  sStack_4c0.pi_ = (sp_counted_base *)0x0;
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4b0 = "";
  local_4d8 = &local_518;
  local_4e8[0] = local_4e8[0] & 0xffffff00;
  local_4f0 = &PTR__lazy_ostream_002300f0;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_508 = local_508 & 0xffffffffffffff00;
  local_4f8 = &local_520;
  local_510 = &PTR__lazy_ostream_002300f0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4c0);
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_198,0x575);
  local_4a0 = (char *)((ulong)local_4a0 & 0xffffffffffffff00);
  local_4a8 = &PTR__lazy_ostream_00230130;
  local_498 = &boost::unit_test::lazy_ostream::inst;
  local_490 = "";
  local_524 = 0;
  local_4d0[0] = *(int *)&p_Var4[1].field_0x4 == 0;
  local_518 = (_Base_ptr)&p_Var4[1].field_0x4;
  local_4c8 = 0;
  sStack_4c0.pi_ = (sp_counted_base *)0x0;
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4b0 = "";
  local_4e8[0] = local_4e8[0] & 0xffffff00;
  local_4f0 = &PTR__lazy_ostream_002300f0;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = &local_518;
  local_520 = &local_524;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_002300f0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4c0);
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b8,0x577);
  local_518 = p_Var4 + 1;
  local_4a0 = (char *)((ulong)local_4a0 & 0xffffffffffffff00);
  local_4a8 = &PTR__lazy_ostream_00230130;
  local_498 = &boost::unit_test::lazy_ostream::inst;
  local_490 = "";
  local_524 = 0xffffffff;
  local_4d0[0] = local_518->_M_color == ~_S_red;
  local_4c8 = 0;
  sStack_4c0.pi_ = (sp_counted_base *)0x0;
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4b0 = "";
  local_4e8[0] = local_4e8[0] & 0xffffff00;
  local_4f0 = &PTR__lazy_ostream_002300f0;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = &local_518;
  local_520 = &local_524;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_002300f0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4c0);
  p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d8,0x579);
  local_4a0 = (char *)((ulong)local_4a0 & 0xffffffffffffff00);
  local_4a8 = &PTR__lazy_ostream_00230130;
  local_498 = &boost::unit_test::lazy_ostream::inst;
  local_490 = "";
  local_524 = 0;
  local_4d0[0] = *(int *)&p_Var9[1]._M_parent == 0;
  local_518 = (_Base_ptr)&p_Var9[1]._M_parent;
  local_4c8 = 0;
  sStack_4c0.pi_ = (sp_counted_base *)0x0;
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4b0 = "";
  local_4e8[0] = local_4e8[0] & 0xffffff00;
  local_4f0 = &PTR__lazy_ostream_002300f0;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = &local_518;
  local_520 = &local_524;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_002300f0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4c0);
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f8,0x57a);
  local_4a0 = (char *)((ulong)local_4a0 & 0xffffffffffffff00);
  local_4a8 = &PTR__lazy_ostream_00230130;
  local_498 = &boost::unit_test::lazy_ostream::inst;
  local_490 = "";
  local_524 = 1;
  local_4d0[0] = *(int *)&p_Var9[1].field_0x4 == 1;
  local_518 = (_Base_ptr)&p_Var9[1].field_0x4;
  local_4c8 = 0;
  sStack_4c0.pi_ = (sp_counted_base *)0x0;
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4b0 = "";
  local_4e8[0] = local_4e8[0] & 0xffffff00;
  local_4f0 = &PTR__lazy_ostream_002300f0;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = &local_518;
  local_520 = &local_524;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_002300f0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4c0);
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_218,0x57b);
  local_518 = p_Var9 + 1;
  local_4a0 = (char *)((ulong)local_4a0 & 0xffffffffffffff00);
  local_4a8 = &PTR__lazy_ostream_00230130;
  local_498 = &boost::unit_test::lazy_ostream::inst;
  local_490 = "";
  local_524 = 3;
  local_4d0[0] = local_518->_M_color == 3;
  local_4c8 = 0;
  sStack_4c0.pi_ = (sp_counted_base *)0x0;
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4b0 = "";
  local_4e8[0] = local_4e8[0] & 0xffffff00;
  local_4f0 = &PTR__lazy_ostream_002300f0;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = &local_518;
  local_520 = &local_524;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_002300f0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4c0);
  p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_238,0x57d);
  local_4a0 = (char *)((ulong)local_4a0 & 0xffffffffffffff00);
  local_4a8 = &PTR__lazy_ostream_00230130;
  local_498 = &boost::unit_test::lazy_ostream::inst;
  local_490 = "";
  local_524 = 0;
  local_4d0[0] = *(int *)&p_Var9[1]._M_parent == 0;
  local_518 = (_Base_ptr)&p_Var9[1]._M_parent;
  local_4c8 = 0;
  sStack_4c0.pi_ = (sp_counted_base *)0x0;
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4b0 = "";
  local_4e8[0] = local_4e8[0] & 0xffffff00;
  local_4f0 = &PTR__lazy_ostream_002300f0;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = &local_518;
  local_520 = &local_524;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_002300f0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4c0);
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_258,0x57e);
  local_4a0 = (char *)((ulong)local_4a0 & 0xffffffffffffff00);
  local_4a8 = &PTR__lazy_ostream_00230130;
  local_498 = &boost::unit_test::lazy_ostream::inst;
  local_490 = "";
  local_524 = 2;
  local_4d0[0] = *(int *)&p_Var9[1].field_0x4 == 2;
  local_518 = (_Base_ptr)&p_Var9[1].field_0x4;
  local_4c8 = 0;
  sStack_4c0.pi_ = (sp_counted_base *)0x0;
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4b0 = "";
  local_4e8[0] = local_4e8[0] & 0xffffff00;
  local_4f0 = &PTR__lazy_ostream_002300f0;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = &local_518;
  local_520 = &local_524;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_002300f0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4c0);
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_278,0x57f);
  local_518 = p_Var9 + 1;
  local_4a0 = (char *)((ulong)local_4a0 & 0xffffffffffffff00);
  local_4a8 = &PTR__lazy_ostream_00230130;
  local_498 = &boost::unit_test::lazy_ostream::inst;
  local_490 = "";
  local_524 = 4;
  local_4d0[0] = local_518->_M_color == 4;
  local_4c8 = 0;
  sStack_4c0.pi_ = (sp_counted_base *)0x0;
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4b0 = "";
  local_4e8[0] = local_4e8[0] & 0xffffff00;
  local_4f0 = &PTR__lazy_ostream_002300f0;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = &local_518;
  local_520 = &local_524;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_002300f0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4c0);
  p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_298,0x581);
  local_4a0 = (char *)((ulong)local_4a0 & 0xffffffffffffff00);
  local_4a8 = &PTR__lazy_ostream_00230130;
  local_498 = &boost::unit_test::lazy_ostream::inst;
  local_490 = "";
  local_524 = 0;
  local_4d0[0] = *(int *)&p_Var9[1]._M_parent == 0;
  local_518 = (_Base_ptr)&p_Var9[1]._M_parent;
  local_4c8 = 0;
  sStack_4c0.pi_ = (sp_counted_base *)0x0;
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4b0 = "";
  local_4e8[0] = local_4e8[0] & 0xffffff00;
  local_4f0 = &PTR__lazy_ostream_002300f0;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = &local_518;
  local_520 = &local_524;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_002300f0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4c0);
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2b8,0x582);
  local_4a0 = (char *)((ulong)local_4a0 & 0xffffffffffffff00);
  local_4a8 = &PTR__lazy_ostream_00230130;
  local_498 = &boost::unit_test::lazy_ostream::inst;
  local_490 = "";
  local_524 = 7;
  local_4d0[0] = *(int *)&p_Var9[1].field_0x4 == 7;
  local_518 = (_Base_ptr)&p_Var9[1].field_0x4;
  local_4c8 = 0;
  sStack_4c0.pi_ = (sp_counted_base *)0x0;
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4b0 = "";
  local_4e8[0] = local_4e8[0] & 0xffffff00;
  local_4f0 = &PTR__lazy_ostream_002300f0;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = &local_518;
  local_520 = &local_524;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_002300f0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4c0);
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2d8,0x583);
  local_518 = p_Var9 + 1;
  local_4a0 = (char *)((ulong)local_4a0 & 0xffffffffffffff00);
  local_4a8 = &PTR__lazy_ostream_00230130;
  local_498 = &boost::unit_test::lazy_ostream::inst;
  local_490 = "";
  local_524 = 8;
  local_4d0[0] = local_518->_M_color == 8;
  local_4c8 = 0;
  sStack_4c0.pi_ = (sp_counted_base *)0x0;
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4b0 = "";
  local_4e8[0] = local_4e8[0] & 0xffffff00;
  local_4f0 = &PTR__lazy_ostream_002300f0;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = &local_518;
  local_520 = &local_524;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_002300f0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4c0);
  p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2f8,0x585);
  local_4a0 = (char *)((ulong)local_4a0 & 0xffffffffffffff00);
  local_4a8 = &PTR__lazy_ostream_00230130;
  local_498 = &boost::unit_test::lazy_ostream::inst;
  local_490 = "";
  local_524 = 1;
  local_4d0[0] = *(int *)&p_Var9[1]._M_parent == 1;
  local_518 = (_Base_ptr)&p_Var9[1]._M_parent;
  local_4c8 = 0;
  sStack_4c0.pi_ = (sp_counted_base *)0x0;
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4b0 = "";
  local_4e8[0] = local_4e8[0] & 0xffffff00;
  local_4f0 = &PTR__lazy_ostream_002300f0;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = &local_518;
  local_520 = &local_524;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_002300f0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4c0);
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_318,0x586);
  local_4a0 = (char *)((ulong)local_4a0 & 0xffffffffffffff00);
  local_4a8 = &PTR__lazy_ostream_00230130;
  local_498 = &boost::unit_test::lazy_ostream::inst;
  local_490 = "";
  local_524 = 5;
  local_4d0[0] = *(int *)&p_Var9[1].field_0x4 == 5;
  local_518 = (_Base_ptr)&p_Var9[1].field_0x4;
  local_4c8 = 0;
  sStack_4c0.pi_ = (sp_counted_base *)0x0;
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4b0 = "";
  local_4e8[0] = local_4e8[0] & 0xffffff00;
  local_4f0 = &PTR__lazy_ostream_002300f0;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = &local_518;
  local_520 = &local_524;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_002300f0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4c0);
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_330 = "";
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_338,0x587);
  local_518 = p_Var9 + 1;
  local_4a0 = (char *)((ulong)local_4a0 & 0xffffffffffffff00);
  local_4a8 = &PTR__lazy_ostream_00230130;
  local_498 = &boost::unit_test::lazy_ostream::inst;
  local_490 = "";
  local_524 = 6;
  local_4d0[0] = local_518->_M_color == 6;
  local_4c8 = 0;
  sStack_4c0.pi_ = (sp_counted_base *)0x0;
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4b0 = "";
  local_4e8[0] = local_4e8[0] & 0xffffff00;
  local_4f0 = &PTR__lazy_ostream_002300f0;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = &local_518;
  local_520 = &local_524;
  local_508 = local_508 & 0xffffffffffffff00;
  local_510 = &PTR__lazy_ostream_002300f0;
  sStack_500.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = &local_520;
  boost::test_tools::tt_detail::report_assertion
            (local_4d0,&local_4a8,&local_4b8,0x587,1,2,2,"std::get<2>(*it)",&local_4f0,"6",
             &local_510);
  boost::detail::shared_count::~shared_count(&sStack_4c0);
  puVar10 = (undefined1 *)std::_Rb_tree_increment(p_Var9);
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_358,0x589);
  local_510 = (undefined **)
              CONCAT71(local_510._1_7_,
                       (_Rb_tree_header *)puVar10 == &bars1._M_t._M_impl.super__Rb_tree_header);
  local_508 = 0;
  sStack_500.pi_ = (sp_counted_base *)0x0;
  local_4a8 = (undefined **)0x1f3fb2;
  local_4a0 = "";
  local_4e8[0] = local_4e8[0] & 0xffffff00;
  local_4f0 = &PTR__lazy_ostream_00230270;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_370 = "";
  local_4d8 = (_Base_ptr *)&local_4a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_500);
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_388,0x58b);
  if (bars1._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      bars2._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    bVar8 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::tuple<int,int,int>>,std::_Rb_tree_const_iterator<std::tuple<int,int,int>>>
                      ((_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       &bars1._M_t._M_impl.super__Rb_tree_header,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar8 = false;
  }
  local_510 = (undefined **)CONCAT71(local_510._1_7_,bVar8);
  local_508 = 0;
  sStack_500.pi_ = (sp_counted_base *)0x0;
  local_4a8 = (undefined **)0x1f3fc4;
  local_4a0 = "";
  local_4e8[0] = local_4e8[0] & 0xffffff00;
  local_4f0 = &PTR__lazy_ostream_00230270;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3a0 = "";
  local_4d8 = (_Base_ptr *)&local_4a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_500);
  local_3b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3b0 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3b8,0x58c);
  if (bars1._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      bars3._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    bVar8 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::tuple<int,int,int>>,std::_Rb_tree_const_iterator<std::tuple<int,int,int>>>
                      ((_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       &bars1._M_t._M_impl.super__Rb_tree_header,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar8 = false;
  }
  local_510 = (undefined **)CONCAT71(local_510._1_7_,bVar8);
  local_508 = 0;
  sStack_500.pi_ = (sp_counted_base *)0x0;
  local_4a8 = (undefined **)0x1f3fd3;
  local_4a0 = "";
  local_4e8[0] = local_4e8[0] & 0xffffff00;
  local_4f0 = &PTR__lazy_ostream_00230270;
  local_4e0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = (_Base_ptr *)&local_4a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_500);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars3._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars2._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars1._M_t);
  pCVar5 = m.colSettings_;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&m.matrix_.matrix_._M_h);
  while (m.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    p_Var1 = (m.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt)->_M_nxt;
    operator_delete(m.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt,0x10);
    m.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt = p_Var1;
  }
  memset(m.matrix_.pivotToColumnIndex_._M_h._M_buckets,0,
         m.matrix_.pivotToColumnIndex_._M_h._M_bucket_count << 3);
  pCVar6 = m.colSettings_;
  m.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  m.matrix_.pivotToColumnIndex_._M_h._M_element_count = 0;
  m.matrix_.nextIndex_ = 0;
  m.matrix_.colSettings_ = pCVar5;
  if (m.colSettings_ != (Column_settings *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
              ((pool<boost::default_user_allocator_malloc_free> *)m.colSettings_);
  }
  operator_delete(pCVar6,0x38);
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_true>_>_>
  ::~Chain_matrix(&m.matrix_);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_428);
  return;
}

Assistant:

void test_barcode() {
  struct BarComp {
    bool operator()(const std::tuple<int, int, int>& c1, const std::tuple<int, int, int>& c2) const {
      if (std::get<0>(c1) != std::get<0>(c2)) return std::get<0>(c1) < std::get<0>(c2);
      if (std::get<1>(c1) != std::get<1>(c2)) return std::get<1>(c1) < std::get<1>(c2);
      return std::get<2>(c1) < std::get<2>(c2);
    }
  };

  auto columns = build_longer_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  const auto& barcode = m.get_current_barcode();

  if constexpr (Matrix::Option_list::is_of_boundary_type) {
    columns[5].clear();
  } else {
    columns = build_longer_chain_matrix<typename Matrix::Column>();
  }
  test_content_equality(columns, m);

  if constexpr (Matrix::Option_list::has_row_access) {
    std::vector<witness_content<typename Matrix::Column> > rows;
    if constexpr (Matrix::Option_list::is_of_boundary_type) {
      rows = build_longer_reduced_row_matrix<typename Matrix::Column>();
    } else {
      rows = build_longer_chain_row_matrix<typename Matrix::Column>();
    }
    unsigned int i = 0;
    for (auto& r : rows) {
      if constexpr (Matrix::Option_list::has_removable_rows)
        if (i == 6) continue;
      test_column_equality<typename Matrix::Column>(r, get_ordered_row(m, i++));
    }
  }

  std::set<std::tuple<int, int, int>, BarComp> bars1;
  std::set<std::tuple<int, int, int>, BarComp> bars2;
  std::set<std::tuple<int, int, int>, BarComp> bars3;
  // bars are not ordered the same for all matrices
  for (auto it = barcode.begin(); it != barcode.end(); ++it) {
    // three access possibilities
    bars1.emplace(it->dim, it->birth, it->death);
    bars2.emplace(std::get<2>(*it), std::get<0>(*it), std::get<1>(*it));
    auto [x, y, z] = *it;
    bars3.emplace(z, x, y);
  }
  auto it = bars1.begin();
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 0);
  // TODO: verify why this -1 works...: it->death should be unsigned int, so double conversion
  BOOST_CHECK_EQUAL(std::get<2>(*it), -1);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 3);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 2);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 4);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 7);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 8);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 5);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 6);
  ++it;
  BOOST_CHECK(it == bars1.end());

  BOOST_CHECK(bars1 == bars2);
  BOOST_CHECK(bars1 == bars3);
}